

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void DivisionHelper<long_long,_long,_5>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *t,long *u,longlong *result)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *u;
  if (lVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  lVar2 = *t;
  if (lVar2 == 0) {
    lVar2 = 0;
  }
  else {
    if (lVar1 == -1 && lVar2 == -0x8000000000000000) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    lVar2 = lVar2 / lVar1;
  }
  *result = lVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }